

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

string * __thiscall
cppnet::Address::AsString_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = &bStack_78;
  if (this->_address_type == AT_IPV6) {
    std::operator+(&local_58,"[",&this->_ip);
    std::operator+(&bStack_78,&local_58,"]:");
    std::__cxx11::to_string(&local_38,(uint)this->_port);
    std::operator+(__return_storage_ptr__,&bStack_78,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_78);
    this_00 = &local_58;
  }
  else {
    std::operator+(&bStack_78,&this->_ip,":");
    std::__cxx11::to_string(&local_58,(uint)this->_port);
    std::operator+(__return_storage_ptr__,&bStack_78,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

const std::string Address::AsString() {
    if (_address_type == AT_IPV6) {
        return "[" + _ip + "]:" + std::to_string(_port);

    } else {
        return _ip + ":" + std::to_string(_port);
    }
}